

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADABUMathMatrix3.cpp
# Opt level: O0

void COLLADABU::Math::Matrix3::golubKahanStep(Matrix3 *kA,Matrix3 *kL,Matrix3 *kR)

{
  Real *pRVar1;
  Matrix3 *in_RDX;
  Matrix3 *in_RSI;
  int __x;
  Matrix3 *in_RDI;
  Matrix3 *pMVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar6;
  size_t iCol;
  size_t iRow;
  Real fTmp1;
  Real fTmp0;
  Real fCos;
  Real fSin;
  Real fInvLength;
  Real fZ;
  Real fY;
  Real fRoot2;
  Real fRoot1;
  Real fDiscr;
  Real fDiff;
  Real fTrace;
  Real fT12;
  Real fT22;
  Real fT11;
  double local_f0;
  ulong local_a0;
  ulong local_98;
  
  pRVar1 = operator[](in_RDI,0);
  dVar6 = pRVar1[1];
  pRVar1 = operator[](in_RDI,0);
  dVar4 = pRVar1[1];
  pRVar1 = operator[](in_RDI,1);
  dVar5 = pRVar1[1];
  pRVar1 = operator[](in_RDI,1);
  dVar3 = dVar6 * dVar4 + dVar5 * pRVar1[1];
  pRVar1 = operator[](in_RDI,1);
  dVar6 = pRVar1[2];
  pRVar1 = operator[](in_RDI,1);
  dVar4 = pRVar1[2];
  pRVar1 = operator[](in_RDI,2);
  dVar5 = pRVar1[2];
  pRVar1 = operator[](in_RDI,2);
  dVar4 = dVar6 * dVar4 + dVar5 * pRVar1[2];
  pRVar1 = operator[](in_RDI,1);
  dVar6 = pRVar1[1];
  pRVar1 = operator[](in_RDI,1);
  dVar5 = dVar3 + dVar4;
  dVar3 = dVar3 - dVar4;
  dVar4 = sqrt(dVar3 * dVar3 + dVar6 * pRVar1[2] * 4.0 * dVar6 * pRVar1[2]);
  local_f0 = dVar5 - dVar4;
  pMVar2 = in_RDI;
  pRVar1 = operator[](in_RDI,0);
  dVar6 = *pRVar1;
  __x = (int)pMVar2;
  std::abs(__x);
  std::abs(__x);
  if (extraout_XMM0_Qa <= extraout_XMM0_Qa_00) {
    local_f0 = dVar5 + dVar4;
  }
  local_f0 = local_f0 * 0.5;
  dVar6 = dVar6 - local_f0;
  pRVar1 = operator[](in_RDI,0);
  dVar4 = pRVar1[1];
  dVar5 = sqrt(dVar6 * dVar6 + dVar4 * dVar4);
  dVar4 = dVar4 * (1.0 / dVar5);
  dVar3 = -dVar6 * (1.0 / dVar5);
  pRVar1 = operator[](in_RDI,0);
  dVar6 = *pRVar1;
  pRVar1 = operator[](in_RDI,0);
  dVar5 = pRVar1[1];
  pRVar1 = operator[](in_RDI,0);
  *pRVar1 = dVar3 * dVar6 + -(dVar4 * dVar5);
  pRVar1 = operator[](in_RDI,0);
  pRVar1[1] = dVar4 * dVar6 + dVar3 * dVar5;
  pRVar1 = operator[](in_RDI,1);
  dVar6 = pRVar1[1];
  pRVar1 = operator[](in_RDI,1);
  *pRVar1 = -dVar4 * dVar6;
  pRVar1 = operator[](in_RDI,1);
  pRVar1[1] = dVar3 * pRVar1[1];
  for (local_98 = 0; local_98 < 3; local_98 = local_98 + 1) {
    pRVar1 = operator[](in_RDX,0);
    dVar6 = pRVar1[local_98];
    pRVar1 = operator[](in_RDX,1);
    dVar5 = pRVar1[local_98];
    pRVar1 = operator[](in_RDX,0);
    pRVar1[local_98] = dVar3 * dVar6 + -(dVar4 * dVar5);
    pRVar1 = operator[](in_RDX,1);
    pRVar1[local_98] = dVar4 * dVar6 + dVar3 * dVar5;
  }
  pRVar1 = operator[](in_RDI,0);
  dVar6 = *pRVar1;
  pRVar1 = operator[](in_RDI,1);
  dVar4 = *pRVar1;
  dVar5 = sqrt(dVar6 * dVar6 + dVar4 * dVar4);
  dVar4 = dVar4 * (1.0 / dVar5);
  dVar3 = -dVar6 * (1.0 / dVar5);
  pRVar1 = operator[](in_RDI,0);
  dVar6 = *pRVar1;
  pRVar1 = operator[](in_RDI,1);
  dVar5 = *pRVar1;
  pRVar1 = operator[](in_RDI,0);
  *pRVar1 = dVar3 * dVar6 + -(dVar4 * dVar5);
  pRVar1 = operator[](in_RDI,0);
  dVar6 = pRVar1[1];
  pRVar1 = operator[](in_RDI,1);
  dVar5 = pRVar1[1];
  pRVar1 = operator[](in_RDI,0);
  pRVar1[1] = dVar3 * dVar6 + -(dVar4 * dVar5);
  pRVar1 = operator[](in_RDI,1);
  pRVar1[1] = dVar4 * dVar6 + dVar3 * dVar5;
  pRVar1 = operator[](in_RDI,1);
  dVar6 = pRVar1[2];
  pRVar1 = operator[](in_RDI,0);
  pRVar1[2] = -dVar4 * dVar6;
  pRVar1 = operator[](in_RDI,1);
  pRVar1[2] = dVar3 * pRVar1[2];
  for (local_a0 = 0; local_a0 < 3; local_a0 = local_a0 + 1) {
    pRVar1 = operator[](in_RSI,local_a0);
    dVar6 = *pRVar1;
    pRVar1 = operator[](in_RSI,local_a0);
    dVar5 = pRVar1[1];
    pRVar1 = operator[](in_RSI,local_a0);
    *pRVar1 = dVar3 * dVar6 + -(dVar4 * dVar5);
    pRVar1 = operator[](in_RSI,local_a0);
    pRVar1[1] = dVar4 * dVar6 + dVar3 * dVar5;
  }
  pRVar1 = operator[](in_RDI,0);
  dVar6 = pRVar1[1];
  pRVar1 = operator[](in_RDI,0);
  dVar4 = pRVar1[2];
  dVar5 = sqrt(dVar6 * dVar6 + dVar4 * dVar4);
  dVar4 = dVar4 * (1.0 / dVar5);
  dVar3 = -dVar6 * (1.0 / dVar5);
  pRVar1 = operator[](in_RDI,0);
  dVar6 = pRVar1[1];
  pRVar1 = operator[](in_RDI,0);
  dVar5 = pRVar1[2];
  pRVar1 = operator[](in_RDI,0);
  pRVar1[1] = dVar3 * dVar6 + -(dVar4 * dVar5);
  pRVar1 = operator[](in_RDI,1);
  dVar6 = pRVar1[1];
  pRVar1 = operator[](in_RDI,1);
  dVar5 = pRVar1[2];
  pRVar1 = operator[](in_RDI,1);
  pRVar1[1] = dVar3 * dVar6 + -(dVar4 * dVar5);
  pRVar1 = operator[](in_RDI,1);
  pRVar1[2] = dVar4 * dVar6 + dVar3 * dVar5;
  pRVar1 = operator[](in_RDI,2);
  dVar6 = pRVar1[2];
  pRVar1 = operator[](in_RDI,2);
  pRVar1[1] = -dVar4 * dVar6;
  pRVar1 = operator[](in_RDI,2);
  pRVar1[2] = dVar3 * pRVar1[2];
  for (local_98 = 0; local_98 < 3; local_98 = local_98 + 1) {
    pRVar1 = operator[](in_RDX,1);
    dVar6 = pRVar1[local_98];
    pRVar1 = operator[](in_RDX,2);
    dVar5 = pRVar1[local_98];
    pRVar1 = operator[](in_RDX,1);
    pRVar1[local_98] = dVar3 * dVar6 + -(dVar4 * dVar5);
    pRVar1 = operator[](in_RDX,2);
    pRVar1[local_98] = dVar4 * dVar6 + dVar3 * dVar5;
  }
  pRVar1 = operator[](in_RDI,1);
  dVar6 = pRVar1[1];
  pRVar1 = operator[](in_RDI,2);
  dVar4 = pRVar1[1];
  dVar5 = sqrt(dVar6 * dVar6 + dVar4 * dVar4);
  dVar4 = dVar4 * (1.0 / dVar5);
  dVar3 = -dVar6 * (1.0 / dVar5);
  pRVar1 = operator[](in_RDI,1);
  dVar6 = pRVar1[1];
  pRVar1 = operator[](in_RDI,2);
  dVar5 = pRVar1[1];
  pRVar1 = operator[](in_RDI,1);
  pRVar1[1] = dVar3 * dVar6 + -(dVar4 * dVar5);
  pRVar1 = operator[](in_RDI,1);
  dVar6 = pRVar1[2];
  pRVar1 = operator[](in_RDI,2);
  dVar5 = pRVar1[2];
  pRVar1 = operator[](in_RDI,1);
  pRVar1[2] = dVar3 * dVar6 + -(dVar4 * dVar5);
  pRVar1 = operator[](in_RDI,2);
  pRVar1[2] = dVar4 * dVar6 + dVar3 * dVar5;
  for (local_a0 = 0; local_a0 < 3; local_a0 = local_a0 + 1) {
    pRVar1 = operator[](in_RSI,local_a0);
    dVar6 = pRVar1[1];
    pRVar1 = operator[](in_RSI,local_a0);
    dVar5 = pRVar1[2];
    pRVar1 = operator[](in_RSI,local_a0);
    pRVar1[1] = dVar3 * dVar6 + -(dVar4 * dVar5);
    pRVar1 = operator[](in_RSI,local_a0);
    pRVar1[2] = dVar4 * dVar6 + dVar3 * dVar5;
  }
  return;
}

Assistant:

void Matrix3::golubKahanStep ( Matrix3& kA, Matrix3& kL,
                                       Matrix3& kR )
        {
            Real fT11 = kA[ 0 ][ 1 ] * kA[ 0 ][ 1 ] + kA[ 1 ][ 1 ] * kA[ 1 ][ 1 ];
            Real fT22 = kA[ 1 ][ 2 ] * kA[ 1 ][ 2 ] + kA[ 2 ][ 2 ] * kA[ 2 ][ 2 ];
            Real fT12 = kA[ 1 ][ 1 ] * kA[ 1 ][ 2 ];
            Real fTrace = fT11 + fT22;
            Real fDiff = fT11 - fT22;
            Real fDiscr = sqrt( fDiff * fDiff + 4.0 * fT12 * fT12 );
            Real fRoot1 = 0.5 * ( fTrace + fDiscr );
            Real fRoot2 = 0.5 * ( fTrace - fDiscr );

            // adjust right
            Real fY = kA[ 0 ][ 0 ] - ( std::abs( fRoot1 - fT22 ) <=
                                       std::abs( fRoot2 - fT22 ) ? fRoot1 : fRoot2 );
            Real fZ = kA[ 0 ][ 1 ];
            Real fInvLength = 1/sqrt( fY * fY + fZ * fZ );
            Real fSin = fZ * fInvLength;
            Real fCos = -fY * fInvLength;

            Real fTmp0 = kA[ 0 ][ 0 ];
            Real fTmp1 = kA[ 0 ][ 1 ];
            kA[ 0 ][ 0 ] = fCos * fTmp0 - fSin * fTmp1;
            kA[ 0 ][ 1 ] = fSin * fTmp0 + fCos * fTmp1;
            kA[ 1 ][ 0 ] = -fSin * kA[ 1 ][ 1 ];
            kA[ 1 ][ 1 ] *= fCos;

            size_t iRow;

            for ( iRow = 0; iRow < 3; iRow++ )
            {
                fTmp0 = kR[ 0 ][ iRow ];
                fTmp1 = kR[ 1 ][ iRow ];
                kR[ 0 ][ iRow ] = fCos * fTmp0 - fSin * fTmp1;
                kR[ 1 ][ iRow ] = fSin * fTmp0 + fCos * fTmp1;
            }

            // adjust left
            fY = kA[ 0 ][ 0 ];

            fZ = kA[ 1 ][ 0 ];

            fInvLength = 1/sqrt( fY * fY + fZ * fZ );

            fSin = fZ * fInvLength;

            fCos = -fY * fInvLength;

            kA[ 0 ][ 0 ] = fCos * kA[ 0 ][ 0 ] - fSin * kA[ 1 ][ 0 ];

            fTmp0 = kA[ 0 ][ 1 ];

            fTmp1 = kA[ 1 ][ 1 ];

            kA[ 0 ][ 1 ] = fCos * fTmp0 - fSin * fTmp1;

            kA[ 1 ][ 1 ] = fSin * fTmp0 + fCos * fTmp1;

            kA[ 0 ][ 2 ] = -fSin * kA[ 1 ][ 2 ];

            kA[ 1 ][ 2 ] *= fCos;

            size_t iCol;

            for ( iCol = 0; iCol < 3; iCol++ )
            {
                fTmp0 = kL[ iCol ][ 0 ];
                fTmp1 = kL[ iCol ][ 1 ];
                kL[ iCol ][ 0 ] = fCos * fTmp0 - fSin * fTmp1;
                kL[ iCol ][ 1 ] = fSin * fTmp0 + fCos * fTmp1;
            }

            // adjust right
            fY = kA[ 0 ][ 1 ];

            fZ = kA[ 0 ][ 2 ];

            fInvLength = 1/sqrt( fY * fY + fZ * fZ );

            fSin = fZ * fInvLength;

            fCos = -fY * fInvLength;

            kA[ 0 ][ 1 ] = fCos * kA[ 0 ][ 1 ] - fSin * kA[ 0 ][ 2 ];

            fTmp0 = kA[ 1 ][ 1 ];

            fTmp1 = kA[ 1 ][ 2 ];

            kA[ 1 ][ 1 ] = fCos * fTmp0 - fSin * fTmp1;

            kA[ 1 ][ 2 ] = fSin * fTmp0 + fCos * fTmp1;

            kA[ 2 ][ 1 ] = -fSin * kA[ 2 ][ 2 ];

            kA[ 2 ][ 2 ] *= fCos;

            for ( iRow = 0; iRow < 3; iRow++ )
            {
                fTmp0 = kR[ 1 ][ iRow ];
                fTmp1 = kR[ 2 ][ iRow ];
                kR[ 1 ][ iRow ] = fCos * fTmp0 - fSin * fTmp1;
                kR[ 2 ][ iRow ] = fSin * fTmp0 + fCos * fTmp1;
            }

            // adjust left
            fY = kA[ 1 ][ 1 ];

            fZ = kA[ 2 ][ 1 ];

            fInvLength = 1/sqrt( fY * fY + fZ * fZ );

            fSin = fZ * fInvLength;

            fCos = -fY * fInvLength;

            kA[ 1 ][ 1 ] = fCos * kA[ 1 ][ 1 ] - fSin * kA[ 2 ][ 1 ];

            fTmp0 = kA[ 1 ][ 2 ];

            fTmp1 = kA[ 2 ][ 2 ];

            kA[ 1 ][ 2 ] = fCos * fTmp0 - fSin * fTmp1;

            kA[ 2 ][ 2 ] = fSin * fTmp0 + fCos * fTmp1;

            for ( iCol = 0; iCol < 3; iCol++ )
            {
                fTmp0 = kL[ iCol ][ 1 ];
                fTmp1 = kL[ iCol ][ 2 ];
                kL[ iCol ][ 1 ] = fCos * fTmp0 - fSin * fTmp1;
                kL[ iCol ][ 2 ] = fSin * fTmp0 + fCos * fTmp1;
            }
        }